

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O3

ErrorData * __thiscall
duckdb::DuckTransactionManager::CommitTransaction
          (ErrorData *__return_storage_ptr__,DuckTransactionManager *this,ClientContext *context,
          Transaction *transaction_p)

{
  vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
  *this_00;
  iterator *piVar1;
  lock_guard<std::mutex> __mutex;
  transaction_t new_commit_id;
  pointer pcVar2;
  _Elt_pointer puVar3;
  _Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false> _Var4;
  _Head_base<0UL,_duckdb::StorageLockKey_*,_false> _Var5;
  __uniq_ptr_impl<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
  _Var6;
  _Alloc_hider _Var7;
  undefined1 auVar8 [8];
  undefined4 uVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  _Head_base<0UL,_std::lock_guard<std::mutex>_*,_false> _Var13;
  __int_type _Var14;
  pointer pDVar15;
  StorageManager *pSVar16;
  FatalException *this_01;
  InternalException *pIVar17;
  AttachedDatabase *extraout_RDX;
  AttachedDatabase *extraout_RDX_00;
  AttachedDatabase *extraout_RDX_01;
  AttachedDatabase *db;
  pointer *__ptr;
  pointer __p;
  pointer __old_p;
  UndoBufferProperties UVar18;
  unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>,_true>
  held_wal_lock;
  unique_lock<std::mutex> t_lock;
  ErrorData rollback_error;
  CheckpointDecision checkpoint_decision;
  _Head_base<0UL,_duckdb::StorageCommitState_*,_false> local_188;
  _Head_base<0UL,_duckdb::StorageLockKey_*,_false> local_180;
  __uniq_ptr_impl<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
  local_178;
  string local_170;
  _Head_base<0UL,_duckdb::StorageCommitState_*,_false> local_150;
  unique_lock<std::mutex> local_148;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  undefined1 local_128 [8];
  char local_120 [16];
  CheckpointType local_110 [2];
  atomic<unsigned_long> local_108;
  undefined1 local_100 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0 [56];
  undefined1 local_b8 [24];
  undefined1 local_a0 [48];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_148._M_device = &this->transaction_lock;
  local_148._M_owns = false;
  local_b8._0_8_ = context;
  ::std::unique_lock<std::mutex>::lock(&local_148);
  local_148._M_owns = true;
  bVar10 = AttachedDatabase::IsSystem((this->super_TransactionManager).db);
  if ((((!bVar10) &&
       (bVar10 = AttachedDatabase::IsTemporary((this->super_TransactionManager).db), !bVar10)) &&
      (bVar10 = DuckTransaction::ChangesMade((DuckTransaction *)transaction_p), bVar10)) &&
     (transaction_p->is_read_only == true)) {
    pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
    local_138 = (undefined1  [8])local_128;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,
               "Attempting to commit a transaction that is read-only but has made changes - this should not be possible"
               ,"");
    InternalException::InternalException(pIVar17,(string *)local_138);
    __cxa_throw(pIVar17,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_180._M_head_impl = (StorageLockKey *)0x0;
  UVar18 = UndoBuffer::GetProperties((UndoBuffer *)&transaction_p[2].manager);
  local_b8._8_8_ = UVar18.estimated_size;
  local_b8._16_4_ = UVar18._8_4_;
  local_b8[0x14] = UVar18.has_dropped_entries;
  CanCheckpoint((CheckpointDecision *)local_a0,this,(DuckTransaction *)transaction_p,
                (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                 *)&local_180,(UndoBufferProperties *)(local_b8 + 8));
  ErrorData::ErrorData(__return_storage_ptr__);
  local_178._M_t.
  super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
  .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl =
       (tuple<std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>)
       (_Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
        )0x0;
  local_188._M_head_impl = (StorageCommitState *)0x0;
  db = extraout_RDX;
  if (((bool)local_a0[0] == false) &&
     (bVar10 = DuckTransaction::ShouldWriteToWAL
                         ((DuckTransaction *)transaction_p,(this->super_TransactionManager).db),
     db = extraout_RDX_00, bVar10)) {
    if (transaction_p[3]._vptr_Transaction == (_func_int **)0x0) {
      pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
      local_138 = (undefined1  [8])local_128;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"Transaction writing to WAL does not have the write lock","");
      InternalException::InternalException(pIVar17,(string *)local_138);
      __cxa_throw(pIVar17,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::unique_lock<std::mutex>::unlock(&local_148);
    _Var13._M_head_impl = (lock_guard<std::mutex> *)operator_new(8);
    (_Var13._M_head_impl)->_M_device = &this->wal_lock;
    iVar12 = pthread_mutex_lock((pthread_mutex_t *)&this->wal_lock);
    _Var6._M_t.
    super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
    .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl =
         local_178._M_t.
         super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
         .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl;
    if (iVar12 != 0) {
      ::std::__throw_system_error(iVar12);
    }
    local_138 = (undefined1  [8])0x0;
    if (local_178._M_t.
        super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
        .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
         )0x0) {
      __mutex._M_device =
           *(mutex_type **)
            local_178._M_t.
            super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
            .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl;
      local_178._M_t.
      super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
      .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl =
           (tuple<std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
           )(tuple<std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
             )_Var13._M_head_impl;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex._M_device);
      operator_delete((void *)_Var6._M_t.
                              super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
                              .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>.
                              _M_head_impl);
      _Var13._M_head_impl = (lock_guard<std::mutex> *)local_178;
    }
    local_178._M_t.
    super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
    .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl =
         (tuple<std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>)
         (tuple<std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>)
         _Var13._M_head_impl;
    ::std::
    unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>::
    ~unique_ptr((unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
                 *)local_138);
    DuckTransaction::WriteToWAL
              ((ErrorData *)local_138,(DuckTransaction *)transaction_p,
               (this->super_TransactionManager).db,
               (unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>,_true>
                *)&local_188);
    auVar8 = local_138;
    __return_storage_ptr__->initialized = (bool)local_138[0];
    __return_storage_ptr__->type = local_138[1];
    local_138 = auVar8;
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->raw_message,(string *)&local_130);
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->final_message,(string *)local_110);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&__return_storage_ptr__->extra_info,local_f0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_f0);
    if ((undefined1 *)CONCAT44(local_110[1],local_110[0]) != local_100) {
      operator_delete((undefined1 *)CONCAT44(local_110[1],local_110[0]));
    }
    if (local_130._M_p != local_120) {
      operator_delete(local_130._M_p);
    }
    ::std::unique_lock<std::mutex>::lock(&local_148);
    db = extraout_RDX_01;
  }
  new_commit_id = this->current_start_timestamp;
  this->current_start_timestamp = new_commit_id + 1;
  LOCK();
  (this->last_commit).super___atomic_base<unsigned_long>._M_i = new_commit_id;
  UNLOCK();
  bVar11 = __return_storage_ptr__->initialized;
  if ((bool)bVar11 == false) {
    local_150._M_head_impl = local_188._M_head_impl;
    local_188._M_head_impl = (StorageCommitState *)0x0;
    DuckTransaction::Commit
              ((ErrorData *)local_138,(DuckTransaction *)transaction_p,db,new_commit_id,
               (unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>,_true>
                *)&local_150);
    auVar8 = local_138;
    __return_storage_ptr__->initialized = (bool)local_138[0];
    __return_storage_ptr__->type = local_138[1];
    local_138 = auVar8;
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->raw_message,(string *)&local_130);
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->final_message,(string *)local_110);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&__return_storage_ptr__->extra_info,local_f0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_f0);
    if ((undefined1 *)CONCAT44(local_110[1],local_110[0]) != local_100) {
      operator_delete((undefined1 *)CONCAT44(local_110[1],local_110[0]));
    }
    if (local_130._M_p != local_120) {
      operator_delete(local_130._M_p);
    }
    if (local_150._M_head_impl != (StorageCommitState *)0x0) {
      (*(local_150._M_head_impl)->_vptr_StorageCommitState[1])();
    }
    local_150._M_head_impl = (StorageCommitState *)0x0;
    bVar11 = __return_storage_ptr__->initialized;
  }
  if ((bVar11 & 1) == 0) {
    if (0x400000000000005f < transaction_p[1].active_query.super___atomic_base<unsigned_long>._M_i)
    {
      _Var14 = this->last_committed_version + 1;
      this->last_committed_version = _Var14;
      LOCK();
      transaction_p[1].active_query.super___atomic_base<unsigned_long>._M_i = _Var14;
      UNLOCK();
    }
  }
  else {
    pcVar2 = (__return_storage_ptr__->final_message)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,
               pcVar2 + (__return_storage_ptr__->final_message)._M_string_length);
    CheckpointDecision::CheckpointDecision((CheckpointDecision *)local_138,&local_70);
    local_a0[0] = local_138[0];
    ::std::__cxx11::string::_M_assign((string *)(local_a0 + 8));
    local_a0._40_4_ = local_110[0];
    CheckpointDecision::~CheckpointDecision((CheckpointDecision *)local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    transaction_p[1].context.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    DuckTransaction::Rollback((ErrorData *)local_138,(DuckTransaction *)transaction_p);
    if (local_138[0] == (string)0x1) {
      this_01 = (FatalException *)__cxa_allocate_exception(0x10);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,
                 "Failed to rollback transaction. Cannot continue operation.\nError: %s","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,CONCAT44(local_110[1],local_110[0]),
                 (long)local_108.super___atomic_base<unsigned_long>._M_i +
                 CONCAT44(local_110[1],local_110[0]));
      FatalException::FatalException<std::__cxx11::string>(this_01,&local_170,&local_50);
      __cxa_throw(this_01,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_f0);
    if ((undefined1 *)CONCAT44(local_110[1],local_110[0]) != local_100) {
      operator_delete((undefined1 *)CONCAT44(local_110[1],local_110[0]));
    }
    if (local_130._M_p != local_120) {
      operator_delete(local_130._M_p);
    }
  }
  (*(this->super_TransactionManager)._vptr_TransactionManager[7])(this,local_a0,transaction_p);
  _Var5._M_head_impl = local_180._M_head_impl;
  if (((bool)local_a0[0] == false) && (local_180._M_head_impl != (StorageLockKey *)0x0)) {
    local_180._M_head_impl = (StorageLockKey *)0x0;
    StorageLockKey::~StorageLockKey(_Var5._M_head_impl);
    operator_delete(_Var5._M_head_impl);
  }
  RemoveTransaction((DuckTransactionManager *)local_138,(DuckTransaction *)this,
                    SUB81(transaction_p,0));
  pDVar15 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
            ::operator->((unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                          *)local_138);
  if ((pDVar15->transactions).
      super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pDVar15->transactions).
      super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar12 = pthread_mutex_lock((pthread_mutex_t *)&this->cleanup_queue_lock);
    if (iVar12 != 0) {
      ::std::__throw_system_error(iVar12);
    }
    puVar3 = (this->cleanup_queue).c.
             super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar3 == (this->cleanup_queue).c.
                  super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>>
      ::
      _M_push_back_aux<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>
                ((deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>>
                  *)&this->cleanup_queue,
                 (unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                  *)local_138);
    }
    else {
      (puVar3->
      super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>)._M_t
      .super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
      .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl =
           (DuckCleanupInfo *)local_138;
      local_138 = (undefined1  [8])0x0;
      piVar1 = &(this->cleanup_queue).c.
                super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_queue_lock);
  }
  ::std::unique_lock<std::mutex>::unlock(&local_148);
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)&this->cleanup_lock);
  if (iVar12 == 0) {
    local_170._M_dataplus._M_p = (pointer)0x0;
    iVar12 = pthread_mutex_lock((pthread_mutex_t *)&this->cleanup_queue_lock);
    _Var7._M_p = local_170._M_dataplus._M_p;
    if (iVar12 == 0) {
      puVar3 = (this->cleanup_queue).c.
               super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->cleanup_queue).c.
          super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur != puVar3) {
        _Var4._M_head_impl =
             (puVar3->
             super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
             .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl;
        (puVar3->
        super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
        .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl =
             (DuckCleanupInfo *)0x0;
        if ((DuckCleanupInfo *)local_170._M_dataplus._M_p != (DuckCleanupInfo *)0x0) {
          this_00 = (vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                     *)(local_170._M_dataplus._M_p + 8);
          local_170._M_dataplus._M_p = (pointer)_Var4._M_head_impl;
          ::std::
          vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                     *)this_00);
          operator_delete(_Var7._M_p);
          _Var4._M_head_impl = (DuckCleanupInfo *)local_170._M_dataplus._M_p;
        }
        local_170._M_dataplus._M_p = (pointer)_Var4._M_head_impl;
        ::std::
        deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
        ::pop_front(&(this->cleanup_queue).c);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_queue_lock);
      if ((DuckCleanupInfo *)local_170._M_dataplus._M_p != (DuckCleanupInfo *)0x0) {
        pDVar15 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                  ::operator->((unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                                *)&local_170);
        DuckCleanupInfo::Cleanup(pDVar15);
        _Var7._M_p = local_170._M_dataplus._M_p;
        if ((DuckCleanupInfo *)local_170._M_dataplus._M_p != (DuckCleanupInfo *)0x0) {
          ::std::
          vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                     *)(local_170._M_dataplus._M_p + 8));
          operator_delete(_Var7._M_p);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_lock);
      uVar9 = local_a0._40_4_;
      if ((bool)local_a0[0] == true) {
        pSVar16 = AttachedDatabase::GetStorageManager((this->super_TransactionManager).db);
        (*pSVar16->_vptr_StorageManager[5])(pSVar16,local_b8._0_8_,0x100000001,(ulong)(uint)uVar9);
      }
      auVar8 = local_138;
      if (local_138 != (undefined1  [8])0x0) {
        ::std::
        vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                   *)((long)local_138 + 8));
        operator_delete((void *)auVar8);
      }
      if (local_188._M_head_impl != (StorageCommitState *)0x0) {
        (*(local_188._M_head_impl)->_vptr_StorageCommitState[1])();
      }
      ::std::
      unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>::
      ~unique_ptr((unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
                   *)&local_178);
      CheckpointDecision::~CheckpointDecision((CheckpointDecision *)local_a0);
      _Var5._M_head_impl = local_180._M_head_impl;
      if (local_180._M_head_impl != (StorageLockKey *)0x0) {
        StorageLockKey::~StorageLockKey(local_180._M_head_impl);
        operator_delete(_Var5._M_head_impl);
      }
      ::std::unique_lock<std::mutex>::~unique_lock(&local_148);
      return __return_storage_ptr__;
    }
    ::std::__throw_system_error(iVar12);
  }
  ::std::__throw_system_error(iVar12);
}

Assistant:

ErrorData DuckTransactionManager::CommitTransaction(ClientContext &context, Transaction &transaction_p) {
	auto &transaction = transaction_p.Cast<DuckTransaction>();
	unique_lock<mutex> t_lock(transaction_lock);
	if (!db.IsSystem() && !db.IsTemporary()) {
		if (transaction.ChangesMade()) {
			if (transaction.IsReadOnly()) {
				throw InternalException("Attempting to commit a transaction that is read-only but has made changes - "
				                        "this should not be possible");
			}
		}
	}

	// check if we can checkpoint
	unique_ptr<StorageLockKey> lock;
	auto undo_properties = transaction.GetUndoProperties();
	auto checkpoint_decision = CanCheckpoint(transaction, lock, undo_properties);
	ErrorData error;
	unique_ptr<lock_guard<mutex>> held_wal_lock;
	unique_ptr<StorageCommitState> commit_state;
	if (!checkpoint_decision.can_checkpoint && transaction.ShouldWriteToWAL(db)) {
		// if we are committing changes and we are not checkpointing, we need to write to the WAL
		// since WAL writes can take a long time - we grab the WAL lock here and unlock the transaction lock
		// read-only transactions can bypass this branch and start/commit while the WAL write is happening
		if (!transaction.HasWriteLock()) {
			// sanity check - this transaction should have a write lock
			// the write lock prevents other transactions from checkpointing until this transaction is fully finished
			// if we do not hold the write lock here, other transactions can bypass this branch by auto-checkpoint
			// this would lead to a checkpoint WHILE this thread is writing to the WAL
			// this should never happen
			throw InternalException("Transaction writing to WAL does not have the write lock");
		}
		// unlock the transaction lock while we write to the WAL
		t_lock.unlock();
		// grab the WAL lock and hold it until the entire commit is finished
		held_wal_lock = make_uniq<lock_guard<mutex>>(wal_lock);
		error = transaction.WriteToWAL(db, commit_state);

		// after we finish writing to the WAL we grab the transaction lock again
		t_lock.lock();
	}
	// obtain a commit id for the transaction
	transaction_t commit_id = GetCommitTimestamp();
	// commit the UndoBuffer of the transaction
	if (!error.HasError()) {
		error = transaction.Commit(db, commit_id, std::move(commit_state));
	}
	if (error.HasError()) {
		// commit unsuccessful: rollback the transaction instead
		checkpoint_decision = CheckpointDecision(error.Message());
		transaction.commit_id = 0;
		auto rollback_error = transaction.Rollback();
		if (rollback_error.HasError()) {
			throw FatalException("Failed to rollback transaction. Cannot continue operation.\nError: %s",
			                     rollback_error.Message());
		}
	} else {
		// check if catalog changes were made
		if (transaction.catalog_version >= TRANSACTION_ID_START) {
			transaction.catalog_version = ++last_committed_version;
		}
	}
	OnCommitCheckpointDecision(checkpoint_decision, transaction);

	if (!checkpoint_decision.can_checkpoint && lock) {
		// we won't checkpoint after all: unlock the checkpoint lock again
		lock.reset();
	}

	// commit successful: remove the transaction id from the list of active transactions
	// potentially resulting in garbage collection
	bool store_transaction = undo_properties.has_updates || undo_properties.has_index_deletes ||
	                         undo_properties.has_catalog_changes || error.HasError();

	// Remove the transaction from the list of active transactions and gather cleanup information.
	auto cleanup_info = RemoveTransaction(transaction, store_transaction);
	if (cleanup_info->ScheduleCleanup()) {
		lock_guard<mutex> q_lock(cleanup_queue_lock);
		cleanup_queue.emplace(std::move(cleanup_info));
	}

	// We do not need to hold the transaction lock during cleanup of transactions,
	// as they (1) have been removed, or (2) exited old_transactions.
	t_lock.unlock();

	{
		lock_guard<mutex> c_lock(cleanup_lock);
		unique_ptr<DuckCleanupInfo> top_cleanup_info;
		{
			lock_guard<mutex> q_lock(cleanup_queue_lock);
			if (!cleanup_queue.empty()) {
				top_cleanup_info = std::move(cleanup_queue.front());
				cleanup_queue.pop();
			}
		}
		if (top_cleanup_info) {
			top_cleanup_info->Cleanup();
		}
	}

	// now perform a checkpoint if (1) we are able to checkpoint, and (2) the WAL has reached sufficient size to
	// checkpoint
	if (checkpoint_decision.can_checkpoint) {
		D_ASSERT(lock);
		// we can unlock the transaction lock while checkpointing
		// checkpoint the database to disk
		CheckpointOptions options;
		options.action = CheckpointAction::ALWAYS_CHECKPOINT;
		options.type = checkpoint_decision.type;
		auto &storage_manager = db.GetStorageManager();
		storage_manager.CreateCheckpoint(context, options);
	}
	return error;
}